

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O3

bool __thiscall
metal::scatter(metal *this,ray *r_in,hit_record *rec,vec3 *attenuation,ray *scattered)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  int iVar11;
  int iVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  dVar1 = (r_in->dir).e[2];
  dVar6 = (r_in->dir).e[0];
  dVar7 = (r_in->dir).e[1];
  dVar8 = (rec->normal).e[0];
  dVar9 = (rec->normal).e[1];
  dVar2 = (rec->normal).e[2];
  dVar3 = this->fuzz;
  do {
    iVar11 = rand();
    iVar12 = rand();
    dVar13 = (double)iVar11 * 4.656612873077393e-10 + (double)iVar11 * 4.656612873077393e-10 + -1.0;
    dVar15 = (double)iVar12 * 4.656612873077393e-10 + (double)iVar12 * 4.656612873077393e-10 + -1.0;
    iVar11 = rand();
    dVar14 = (double)iVar11 * 4.656612873077393e-10 + (double)iVar11 * 4.656612873077393e-10 + -1.0;
  } while (1.0 <= dVar14 * dVar14 + dVar13 * dVar13 + dVar15 * dVar15);
  dVar16 = 1.0 / SQRT(dVar1 * dVar1 + dVar6 * dVar6 + dVar7 * dVar7);
  dVar4 = r_in->tm;
  dVar5 = (rec->p).e[0];
  dVar10 = (rec->p).e[1];
  (scattered->orig).e[2] = (rec->p).e[2];
  (scattered->orig).e[0] = dVar5;
  (scattered->orig).e[1] = dVar10;
  dVar5 = dVar1 * dVar16 * dVar2 + dVar16 * dVar6 * dVar8 + dVar9 * dVar16 * dVar7;
  dVar5 = dVar5 + dVar5;
  (scattered->dir).e[0] = (dVar16 * dVar6 - dVar5 * dVar8) + dVar3 * dVar13;
  (scattered->dir).e[1] = (dVar16 * dVar7 - dVar5 * dVar9) + dVar3 * dVar15;
  (scattered->dir).e[2] = (dVar1 * dVar16 - dVar2 * dVar5) + dVar14 * dVar3;
  scattered->tm = dVar4;
  attenuation->e[2] = (this->albedo).e[2];
  dVar1 = (this->albedo).e[1];
  attenuation->e[0] = (this->albedo).e[0];
  attenuation->e[1] = dVar1;
  return 0.0 < (scattered->dir).e[2] * (rec->normal).e[2] +
               (scattered->dir).e[0] * (rec->normal).e[0] +
               (scattered->dir).e[1] * (rec->normal).e[1];
}

Assistant:

virtual bool scatter(
            const ray& r_in, const hit_record& rec, vec3& attenuation, ray& scattered
    ) const {
        vec3 reflected = reflect(unit_vector(r_in.direction()), rec.normal);
        scattered = ray(rec.p, reflected + fuzz * random_in_sphere(), r_in.time());
        attenuation = albedo;
        return (dot(scattered.direction(), rec.normal) > 0);
    }